

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDelegateExpr(BinaryReaderIR *this,Index depth)

{
  pointer pLVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  long lVar3;
  char *pcVar4;
  Location loc;
  Location local_98;
  Var local_78;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
  if (lVar3 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    if (*(int *)((long)pLVar1 + lVar3 + -0x18) == 6) {
      lVar3 = *(long *)((long)pLVar1 + lVar3 + -8);
      if (*(int *)(lVar3 + 0x38) != 0x3c) {
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x4e,
                      "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]");
      }
      if (*(int *)(lVar3 + 0x3c) == 2) {
LAB_00118f1c:
        pcVar4 = this->filename_;
        aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        local_98.field_1.field_0.last_column = 0;
        local_98.filename._M_len = strlen(pcVar4);
        local_98.filename._M_str = pcVar4;
        local_98.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
        Var::Var(&local_78,depth,&local_98);
        Var::operator=((Var *)(lVar3 + 0x1a0),&local_78);
        Var::~Var(&local_78);
        pLVar1 = (this->label_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pLVar1 != (this->label_stack_).
                      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          (this->label_stack_).
          super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
          ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + -1;
          return (Result)Ok;
        }
        PrintError(this,"popping empty label stack");
        return (Result)Ok;
      }
      if (*(int *)(lVar3 + 0x3c) == 0) {
        *(undefined4 *)(lVar3 + 0x3c) = 2;
        goto LAB_00118f1c;
      }
      pcVar4 = "delegate not allowed in try-catch";
    }
    else {
      pcVar4 = "delegate not inside try block";
    }
    PrintError(this,pcVar4);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderIR::OnDelegateExpr(Index depth) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("delegate not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Delegate;
  } else if (try_->kind != TryKind::Delegate) {
    PrintError("delegate not allowed in try-catch");
    return Result::Error;
  }

  try_->delegate_target = Var(depth, GetLocation());

  PopLabel();
  return Result::Ok;
}